

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureSizeTests::init(TextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  TestContext *pTVar3;
  deBool dVar4;
  TestNode *pTVar5;
  ostream *poVar6;
  Texture2DSizeCase *this_00;
  RenderContext *pRVar7;
  ulong extraout_RAX;
  TextureCubeSizeCase *this_01;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  string local_440 [32];
  ostringstream local_420 [8];
  ostringstream name_1;
  int mipmap_1;
  int formatNdx_1;
  bool isPOT_1;
  int height_1;
  int width_1;
  int sizeNdx_1;
  TestCaseGroup *groupCube;
  string local_280 [32];
  ostringstream local_260 [8];
  ostringstream name;
  int local_e0;
  int mipmap;
  int formatNdx;
  bool isPOT;
  int height;
  int width;
  int sizeNdx;
  TestCaseGroup *group2D;
  anon_struct_16_3_5cb0d78b formats [4];
  anon_struct_8_2_6a0cb59c sizesCube [6];
  anon_struct_8_2_6a0cb59c sizes2D [5];
  TextureSizeTests *this_local;
  
  sizesCube[5].width = 0x40;
  sizesCube[5].height = 0x40;
  sizesCube[3].width = 0x100;
  sizesCube[3].height = 0x100;
  sizesCube[4].width = 0x200;
  sizesCube[4].height = 0x200;
  sizesCube[1].width = 0x40;
  sizesCube[1].height = 0x40;
  sizesCube[2].width = 0x80;
  sizesCube[2].height = 0x80;
  formats[3].format = 0xf;
  formats[3].dataType = 0xf;
  sizesCube[0].width = 0x10;
  sizesCube[0].height = 0x10;
  formats[2]._8_8_ = anon_var_dwarf_27824;
  formats[3].name = (char *)0x140100001908;
  formats[1]._8_8_ = anon_var_dwarf_c23c99;
  formats[2].name = (char *)0x140100001907;
  formats[0]._8_8_ = anon_var_dwarf_c23ca4;
  formats[1].name = (char *)0x803300001908;
  formats[0].name = (char *)0x140100001909;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Size Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (height = 0; height < 5; height = height + 1) {
    iVar1 = sizesCube[(long)height + 5].width;
    iVar2 = sizesCube[(long)height + 5].height;
    dVar4 = ::deIsPowerOfTwo32(iVar1);
    bVar11 = false;
    if (dVar4 != 0) {
      dVar4 = ::deIsPowerOfTwo32(iVar2);
      bVar11 = dVar4 != 0;
    }
    for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
      name._372_4_ = 0;
      while( true ) {
        iVar9 = 1;
        if (bVar11) {
          iVar9 = 2;
        }
        if (iVar9 <= (int)name._372_4_) break;
        std::__cxx11::ostringstream::ostringstream(local_260);
        poVar6 = (ostream *)std::ostream::operator<<(local_260,iVar1);
        poVar6 = std::operator<<(poVar6,"x");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
        poVar6 = std::operator<<(poVar6,"_");
        poVar6 = std::operator<<(poVar6,*(char **)&formats[(long)local_e0 + -1].format);
        pcVar10 = "";
        if (name._372_4_ != 0) {
          pcVar10 = "_mipmap";
        }
        std::operator<<(poVar6,pcVar10);
        this_00 = (Texture2DSizeCase *)operator_new(0xf0);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar7 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        Texture2DSizeCase::Texture2DSizeCase
                  (this_00,pTVar3,pRVar7,pcVar10,"",*(deUint32 *)&formats[local_e0].name,
                   *(deUint32 *)((long)&formats[local_e0].name + 4),iVar1,iVar2,name._372_4_ != 0);
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::ostringstream::~ostringstream(local_260);
        name._372_4_ = name._372_4_ + 1;
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap Texture Size Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  height_1 = 0;
  uVar8 = extraout_RAX;
  while (height_1 < 6) {
    iVar1 = sizesCube[(long)height_1 + -1].width;
    iVar2 = sizesCube[(long)height_1 + -1].height;
    dVar4 = ::deIsPowerOfTwo32(iVar1);
    bVar11 = false;
    if (dVar4 != 0) {
      dVar4 = ::deIsPowerOfTwo32(iVar2);
      bVar11 = dVar4 != 0;
    }
    for (name_1._372_4_ = 0; (int)name_1._372_4_ < 4; name_1._372_4_ = name_1._372_4_ + 1) {
      name_1._368_4_ = 0;
      while( true ) {
        iVar9 = 1;
        if (bVar11) {
          iVar9 = 2;
        }
        if (iVar9 <= (int)name_1._368_4_) break;
        std::__cxx11::ostringstream::ostringstream(local_420);
        poVar6 = (ostream *)std::ostream::operator<<(local_420,iVar1);
        poVar6 = std::operator<<(poVar6,"x");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
        poVar6 = std::operator<<(poVar6,"_");
        poVar6 = std::operator<<(poVar6,*(char **)&formats[(long)(int)name_1._372_4_ + -1].format);
        pcVar10 = "";
        if (name_1._368_4_ != 0) {
          pcVar10 = "_mipmap";
        }
        std::operator<<(poVar6,pcVar10);
        this_01 = (TextureCubeSizeCase *)operator_new(0xf8);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar7 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        TextureCubeSizeCase::TextureCubeSizeCase
                  (this_01,pTVar3,pRVar7,pcVar10,"",*(deUint32 *)&formats[(int)name_1._372_4_].name,
                   *(deUint32 *)((long)&formats[(int)name_1._372_4_].name + 4),iVar1,iVar2,
                   name_1._368_4_ != 0);
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
        std::__cxx11::string::~string(local_440);
        std::__cxx11::ostringstream::~ostringstream(local_420);
        name_1._368_4_ = name_1._368_4_ + 1;
      }
    }
    height_1 = height_1 + 1;
    uVar8 = (ulong)(uint)height_1;
  }
  return (int)uVar8;
}

Assistant:

void TextureSizeTests::init (void)
{
	struct
	{
		int	width;
		int	height;
	} sizes2D[] =
	{
		{   64,   64 }, // Spec-mandated minimum.
		{   65,   63 },
		{  512,  512 },
		{ 1024, 1024 },
		{ 2048, 2048 }
	};

	struct
	{
		int	width;
		int	height;
	} sizesCube[] =
	{
		{  15,  15 },
		{  16,  16 }, // Spec-mandated minimum
		{  64,  64 },
		{ 128, 128 },
		{ 256, 256 },
		{ 512, 512 }
	};

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} formats[] =
	{
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// 2D cases.
	tcu::TestCaseGroup* group2D = new tcu::TestCaseGroup(m_testCtx, "2d", "2D Texture Size Tests");
	addChild(group2D);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes2D); sizeNdx++)
	{
		int		width	= sizes2D[sizeNdx].width;
		int		height	= sizes2D[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				group2D->addChild(new Texture2DSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
														formats[formatNdx].format, formats[formatNdx].dataType,
														width, height, mipmap != 0));
			}
		}
	}

	// Cubemap cases.
	tcu::TestCaseGroup* groupCube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap Texture Size Tests");
	addChild(groupCube);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCube); sizeNdx++)
	{
		int		width	= sizesCube[sizeNdx].width;
		int		height	= sizesCube[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				groupCube->addChild(new TextureCubeSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
															formats[formatNdx].format, formats[formatNdx].dataType,
															width, height, mipmap != 0));
			}
		}
	}
}